

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O2

void __thiscall node::BlockAssembler::onlyUnconfirmed(BlockAssembler *this,setEntries *testSet)

{
  size_type sVar1;
  const_iterator cVar2;
  const_iterator __position;
  long in_FS_OFFSET;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2._M_node = (testSet->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while (__position._M_node = cVar2._M_node,
        (_Rb_tree_header *)__position._M_node != &(testSet->_M_t)._M_impl.super__Rb_tree_header) {
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,
               *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)
                (__position._M_node + 1));
    sVar1 = std::
            _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(this->inBlock)._M_h,&(local_48._M_ptr)->hash);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if (sVar1 != 0) {
      std::
      _Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<...lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
      ::erase_abi_cxx11_((_Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<___lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                          *)testSet,__position);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockAssembler::onlyUnconfirmed(CTxMemPool::setEntries& testSet)
{
    for (CTxMemPool::setEntries::iterator iit = testSet.begin(); iit != testSet.end(); ) {
        // Only test txs not already in the block
        if (inBlock.count((*iit)->GetSharedTx()->GetHash())) {
            testSet.erase(iit++);
        } else {
            iit++;
        }
    }
}